

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O3

bool read_gt_data(string *filename,vector<ground_truth,_std::allocator<ground_truth>_> *gt)

{
  pointer *ppgVar1;
  iterator __position;
  char cVar2;
  long lVar3;
  istream *piVar4;
  uint uVar5;
  ground_truth single_gt;
  double azimuth;
  double y;
  double x;
  string line_pos;
  ifstream in_file_pos;
  istringstream iss_pos;
  undefined1 auStack_418 [12];
  uint local_40c;
  ground_truth local_408;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  long local_3b8 [4];
  uint auStack_398 [122];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::ifstream::ifstream(local_3b8,(filename->_M_dataplus)._M_p,_S_in);
  lVar3 = *(long *)(local_3b8[0] + -0x18);
  uVar5 = *(uint *)((long)auStack_398 + lVar3);
  if ((uVar5 & 5) == 0) {
    local_3d8 = local_3c8;
    local_3d0 = 0;
    local_3c8[0] = 0;
    local_40c = uVar5;
    while( true ) {
      cVar2 = std::ios::widen((char)auStack_418 + (char)lVar3 + '`');
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3b8,(string *)&local_3d8,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_3d8,_S_in);
      std::istream::_M_extract<double>((double *)local_1b0);
      std::istream::_M_extract<double>((double *)local_1b0);
      std::istream::_M_extract<double>((double *)local_1b0);
      local_408.x = local_3e0;
      local_408.y = local_3e8;
      local_408.theta = local_3f0;
      __position._M_current =
           (gt->super__Vector_base<ground_truth,_std::allocator<ground_truth>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (gt->super__Vector_base<ground_truth,_std::allocator<ground_truth>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ground_truth,std::allocator<ground_truth>>::
        _M_realloc_insert<ground_truth_const&>
                  ((vector<ground_truth,std::allocator<ground_truth>> *)gt,__position,&local_408);
      }
      else {
        (__position._M_current)->theta = local_3f0;
        (__position._M_current)->x = local_3e0;
        (__position._M_current)->y = local_3e8;
        ppgVar1 = &(gt->super__Vector_base<ground_truth,_std::allocator<ground_truth>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppgVar1 = *ppgVar1 + 1;
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
      lVar3 = *(long *)(local_3b8[0] + -0x18);
    }
    uVar5 = local_40c;
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8);
      uVar5 = local_40c;
    }
  }
  std::ifstream::~ifstream(local_3b8);
  return (uVar5 & 5) == 0;
}

Assistant:

inline bool read_gt_data(const std::string& filename, std::vector<ground_truth>& gt) {

	// Get file of position measurements:
	std::ifstream in_file_pos(filename.c_str(),std::ifstream::in);
	// Return if we can't open the file.
	if (!in_file_pos) {
		return false;
	}

	// Declare single line of position measurement file:
	std::string line_pos;

	// Run over each single line:
	while(getline(in_file_pos, line_pos)){

		std::istringstream iss_pos(line_pos);

		// Declare position values:
		double x, y, azimuth;

		// Declare single ground truth:
		ground_truth single_gt; 

		//read data from line to values:
		iss_pos >> x;
		iss_pos >> y;
		iss_pos >> azimuth;

		// Set values
		single_gt.x = x;
		single_gt.y = y;
		single_gt.theta = azimuth;

		// Add to list of control measurements and ground truth:
		gt.push_back(single_gt);
	}
	return true;
}